

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::udp_tracker_connection::fail
          (udp_tracker_connection *this,error_code *ec,operation_t op,char *msg,seconds32 interval,
          seconds32 min_interval)

{
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *this_00;
  endpoint *this_01;
  pointer pbVar1;
  pointer pbVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  session_settings *this_02;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  int completion_timeout;
  int read_timeout;
  __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  __position;
  endpoint *ep;
  endpoint *ep_00;
  shared_ptr<libtorrent::aux::request_callback> cb;
  undefined1 local_b0 [24];
  undefined1 local_98 [48];
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  this_00 = &this->m_endpoints;
  pbVar1 = (this->m_endpoints).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_endpoints).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = &this->m_target;
  local_b0._16_8_ = msg;
  make_tcp((endpoint *)local_98,this_01);
  __position = ::std::
               __find_if<__gnu_cxx::__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const>>
                         (pbVar1,pbVar2,(endpoint *)local_98);
  if (__position._M_current !=
      (this->m_endpoints).
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
    ::erase(this_00,(const_iterator)__position._M_current);
    __position._M_current =
         (this->m_endpoints).
         super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((((this_00->
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        )._M_impl.super__Vector_impl_data._M_start == __position._M_current) ||
      (p_Var3 = (this->super_tracker_connection).m_req.outgoing_socket.m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi, p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
     || (p_Var3->_M_use_count == 0)) {
    tracker_connection::fail
              (&this->super_tracker_connection,ec,op,(char *)local_b0._16_8_,interval,min_interval);
  }
  else {
    tracker_connection::requester((tracker_connection *)local_b0);
    if ((_func_int **)local_b0._0_8_ != (_func_int **)0x0) {
      cVar7 = (**(code **)(*(_func_int **)local_b0._0_8_ + 0x30))();
      uVar6 = local_b0._0_8_;
      if (cVar7 != '\0') {
        pcVar4 = (this->m_hostname)._M_dataplus._M_p;
        print_endpoint_abi_cxx11_((string *)local_98,(aux *)this_01,ep);
        uVar5 = CONCAT44(local_98._4_4_,local_98._0_4_);
        (*ec->cat_->_vptr_error_category[4])(local_50,ec->cat_,(ulong)(uint)ec->val_);
        (**(code **)(*(_func_int **)uVar6 + 0x38))
                  (uVar6,"*** UDP_TRACKER [ host: \"%s\" ip: \"%s\" | ERROR: \"%s\" ]",pcVar4,uVar5,
                   local_50._0_8_);
        ::std::__cxx11::string::~string((string *)local_50);
        ::std::__cxx11::string::~string((string *)local_98);
      }
    }
    make_udp((endpoint *)local_98,
             (this_00->
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0xc) = local_98._12_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0x10) = local_98._16_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0x14) = local_98._20_4_;
    (this->m_target).impl_.data_.v6.sin6_scope_id = local_98._24_4_;
    *(undefined4 *)&(this_01->impl_).data_ = local_98._0_4_;
    (this->m_target).impl_.data_.v4.sin_addr.s_addr = local_98._4_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 8) = local_98._8_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0xc) = local_98._12_4_;
    if ((_func_int **)local_b0._0_8_ != (_func_int **)0x0) {
      cVar7 = (**(code **)(*(_func_int **)local_b0._0_8_ + 0x30))();
      if (cVar7 != '\0') {
        pcVar4 = (this->m_hostname)._M_dataplus._M_p;
        print_endpoint_abi_cxx11_((string *)local_98,(aux *)this_01,ep_00);
        (**(code **)(*(_func_int **)local_b0._0_8_ + 0x38))
                  (local_b0._0_8_,"*** UDP_TRACKER trying next IP [ host: \"%s\" ip: \"%s\" ]",
                   pcVar4,CONCAT44(local_98._4_4_,local_98._0_4_));
        ::std::__cxx11::string::~string((string *)local_98);
      }
    }
    boost::asio::execution::
    any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
    ::any_executor((any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
                    *)local_98,
                   &(this->super_tracker_connection).super_timeout_handler.m_timeout.impl_.executor_
                  );
    shared_from_this((udp_tracker_connection *)local_68);
    local_50._0_8_ = start_announce;
    local_50._8_8_ = 0;
    local_40._0_8_ = local_68._0_8_;
    local_40._8_8_ = local_68._8_8_;
    local_68._0_8_ = (wait_op *)0x0;
    local_68._8_8_ = (element_type *)0x0;
    boost::asio::
    post<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,std::_Bind<void(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>))()>>
              ((any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
                *)local_98,
               (_Bind<void_(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>))()>
                *)local_50,(type *)0x0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    boost::asio::execution::detail::any_executor_base::~any_executor_base
              ((any_executor_base *)local_98);
    this_02 = ((this->super_tracker_connection).m_man)->m_settings;
    completion_timeout =
         session_settings::get_int
                   (this_02,(uint)((this->super_tracker_connection).m_req.event == stopped) * 2 +
                            0x4000);
    read_timeout = session_settings::get_int(this_02,0x4001);
    timeout_handler::set_timeout((timeout_handler *)this,completion_timeout,read_timeout);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
  }
  return;
}

Assistant:

void udp_tracker_connection::fail(error_code const& ec, operation_t const op
		, char const* msg, seconds32 const interval, seconds32 const min_interval)
	{
		// m_target failed. remove it from the endpoint list
		auto const i = std::find(m_endpoints.begin()
			, m_endpoints.end(), make_tcp(m_target));

		if (i != m_endpoints.end()) m_endpoints.erase(i);

		// if that was the last one, or the listen socket was closed
		// fail the whole announce
		if (m_endpoints.empty() || !tracker_req().outgoing_socket)
		{
			tracker_connection::fail(ec, op, msg, interval, min_interval);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb && cb->should_log())
		{
			cb->debug_log(R"(*** UDP_TRACKER [ host: "%s" ip: "%s" | ERROR: "%s" ])"
				, m_hostname.c_str(), print_endpoint(m_target).c_str(), ec.message().c_str());
		}
#endif

		// pick another target endpoint and try again
		m_target = make_udp(m_endpoints.front());

#ifndef TORRENT_DISABLE_LOGGING
		if (cb && cb->should_log())
		{
			cb->debug_log(R"(*** UDP_TRACKER trying next IP [ host: "%s" ip: "%s" ])"
				, m_hostname.c_str(), print_endpoint(m_target).c_str());
		}
#endif
		post(get_executor(), std::bind(
			&udp_tracker_connection::start_announce, shared_from_this()));

		aux::session_settings const& settings = m_man.settings();
		set_timeout(tracker_req().event == event_t::stopped
			? settings.get_int(settings_pack::stop_tracker_timeout)
			: settings.get_int(settings_pack::tracker_completion_timeout)
			, settings.get_int(settings_pack::tracker_receive_timeout));
	}